

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O3

void __thiscall Image_ExrMetadata_Test::~Image_ExrMetadata_Test(Image_ExrMetadata_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Image, ExrMetadata) {
    Point2i res(16, 32);
    pstd::vector<float> rgbPixels = GetFloatPixels(res, 3);
    Image image(rgbPixels, res, {"R", "G", "B"});

    std::string filename = "metadata.exr";
    ImageMetadata outMetadata;
    outMetadata.colorSpace = RGBColorSpace::Rec2020;
    outMetadata.renderTimeSeconds = 1234;
    SquareMatrix<4> w2c(3, 1, 4, 1, 5, 9, 2, Pi, 2, 7, 1, 8, 2, 8, 1, std::exp(1.f));
    SquareMatrix<4> w2n(1.5, 2.5, 3.5, 4.75, 5.333, 6.2135, -351.2, -552., 63.2, 47.2, Pi,
                        std::cos(1.f), 0, -14, 6, 1e-10f);
    // Must be the same area as image resolution.
    Bounds2i pb(Point2i(2, 10), Point2i(18, 42));
    Point2i fullRes(1000, 200);
    std::map<std::string, std::vector<std::string>> stringVectors;
    stringVectors["yolo"] = {"foo", "bar"};

    outMetadata.cameraFromWorld = w2c;
    outMetadata.NDCFromWorld = w2n;
    outMetadata.pixelBounds = pb;
    outMetadata.fullResolution = fullRes;
    outMetadata.stringVectors = stringVectors;
    EXPECT_TRUE(image.Write(filename, outMetadata));

    ImageAndMetadata read = Image::Read(filename);
    ImageMetadata &inMetadata = read.metadata;

    EXPECT_EQ(*RGBColorSpace::Rec2020, *inMetadata.GetColorSpace());

    EXPECT_TRUE((bool)inMetadata.renderTimeSeconds);
    EXPECT_EQ(1234, *inMetadata.renderTimeSeconds);

    EXPECT_TRUE((bool)inMetadata.cameraFromWorld);
    EXPECT_EQ(*inMetadata.cameraFromWorld, w2c);

    EXPECT_TRUE((bool)inMetadata.NDCFromWorld);
    EXPECT_EQ(*inMetadata.NDCFromWorld, w2n);

    EXPECT_TRUE((bool)inMetadata.pixelBounds);
    EXPECT_EQ(*inMetadata.pixelBounds, pb);

    EXPECT_TRUE((bool)inMetadata.fullResolution);
    EXPECT_EQ(*inMetadata.fullResolution, fullRes);

    EXPECT_EQ(1, inMetadata.stringVectors.size());
    auto iter = stringVectors.find("yolo");
    EXPECT_TRUE(iter != stringVectors.end());
    EXPECT_EQ("foo", iter->second[0]);
    EXPECT_EQ("bar", iter->second[1]);

    EXPECT_EQ(0, remove(filename.c_str()));
}